

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::relocate
          (QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *this,qsizetype offset,
          TimerInfoV2 **data)

{
  bool bVar1;
  TimerInfoV2 *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  TimerInfoV2 *res;
  
  first = (TimerInfoV2 *)(*(long *)(in_RDI + 8) + in_RSI * 0x10);
  QtPrivate::q_relocate_overlap_n<QAbstractEventDispatcher::TimerInfoV2,long_long>
            (first,in_RDI,(TimerInfoV2 *)0x331777);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>,QAbstractEventDispatcher::TimerInfoV2_const*>
                        (data,(QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *)res),
     bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  *(TimerInfoV2 **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }